

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<8,_16777232,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  byte bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  AABBNodeMB4D *node1;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  long lVar13;
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  Primitive *prim;
  ulong uVar20;
  ulong uVar21;
  undefined4 uVar22;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined1 auVar32 [16];
  uint uVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24d1;
  ulong local_24d0;
  ulong local_24c8;
  RayHit *local_24c0;
  RayQueryContext *local_24b8;
  long local_24b0;
  ulong local_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar23 [64];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar7 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0;
    auVar24 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar34 = (ray->super_RayK<1>).tfar;
    auVar27 = ZEXT464((uint)fVar34);
    auVar28 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar34));
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    auVar29 = vandps_avx((undefined1  [16])aVar1,auVar29);
    auVar35._8_4_ = 0x219392ef;
    auVar35._0_8_ = 0x219392ef219392ef;
    auVar35._12_4_ = 0x219392ef;
    auVar29 = vcmpps_avx(auVar29,auVar35,1);
    auVar29 = vblendvps_avx((undefined1  [16])aVar1,auVar35,auVar29);
    auVar35 = vrcpps_avx(auVar29);
    auVar36._8_4_ = 0x3f800000;
    auVar36._0_8_ = 0x3f8000003f800000;
    auVar36._12_4_ = 0x3f800000;
    auVar29 = vfnmadd231ps_fma(auVar36,auVar35,auVar29);
    auVar30 = vfmadd132ps_fma(auVar29,auVar35,auVar35);
    fVar34 = auVar30._0_4_;
    local_23c0._4_4_ = fVar34;
    local_23c0._0_4_ = fVar34;
    local_23c0._8_4_ = fVar34;
    local_23c0._12_4_ = fVar34;
    local_23c0._16_4_ = fVar34;
    local_23c0._20_4_ = fVar34;
    local_23c0._24_4_ = fVar34;
    local_23c0._28_4_ = fVar34;
    auVar40 = ZEXT3264(local_23c0);
    auVar29 = vmovshdup_avx(auVar30);
    uVar31 = auVar29._0_8_;
    local_23e0._8_8_ = uVar31;
    local_23e0._0_8_ = uVar31;
    local_23e0._16_8_ = uVar31;
    local_23e0._24_8_ = uVar31;
    auVar41 = ZEXT3264(local_23e0);
    auVar36 = vshufpd_avx(auVar30,auVar30,1);
    auVar35 = vshufps_avx(auVar30,auVar30,0xaa);
    uVar31 = auVar35._0_8_;
    local_2400._8_8_ = uVar31;
    local_2400._0_8_ = uVar31;
    local_2400._16_8_ = uVar31;
    local_2400._24_8_ = uVar31;
    auVar42 = ZEXT3264(local_2400);
    auVar37._0_4_ = fVar34 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar37._4_4_ = auVar30._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar37._8_4_ = auVar30._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar37._12_4_ = auVar30._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    auVar35 = vmovshdup_avx(auVar37);
    auVar30 = vshufps_avx(auVar37,auVar37,0xaa);
    local_24c8 = (ulong)(fVar34 < 0.0) << 5;
    uVar18 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x40;
    local_24a8 = (ulong)(auVar36._0_4_ < 0.0) << 5 | 0x80;
    uVar20 = local_24c8 ^ 0x20;
    uVar21 = uVar18 ^ 0x20;
    uVar12 = local_24a8 ^ 0x20;
    uVar22 = auVar28._0_4_;
    auVar23 = ZEXT3264(CONCAT428(uVar22,CONCAT424(uVar22,CONCAT420(uVar22,CONCAT416(uVar22,CONCAT412
                                                  (uVar22,CONCAT48(uVar22,CONCAT44(uVar22,uVar22))))
                                                  ))));
    uVar19 = CONCAT44(auVar37._0_4_,auVar37._0_4_);
    local_2420._0_8_ = uVar19 ^ 0x8000000080000000;
    local_2420._8_4_ = -auVar37._0_4_;
    local_2420._12_4_ = -auVar37._0_4_;
    local_2420._16_4_ = -auVar37._0_4_;
    local_2420._20_4_ = -auVar37._0_4_;
    local_2420._24_4_ = -auVar37._0_4_;
    local_2420._28_4_ = -auVar37._0_4_;
    auVar38 = ZEXT3264(local_2420);
    uVar17 = auVar35._0_4_;
    uVar33 = auVar35._4_4_;
    local_2440._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
    local_2440._8_4_ = uVar17 ^ 0x80000000;
    local_2440._12_4_ = uVar33 ^ 0x80000000;
    local_2440._16_4_ = uVar17 ^ 0x80000000;
    local_2440._20_4_ = uVar33 ^ 0x80000000;
    local_2440._24_4_ = uVar17 ^ 0x80000000;
    local_2440._28_4_ = uVar33 ^ 0x80000000;
    auVar39 = ZEXT3264(local_2440);
    uVar17 = auVar30._0_4_;
    uVar33 = auVar30._4_4_;
    local_2460._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
    local_2460._8_4_ = uVar17 ^ 0x80000000;
    local_2460._12_4_ = uVar33 ^ 0x80000000;
    local_2460._16_4_ = uVar17 ^ 0x80000000;
    local_2460._20_4_ = uVar33 ^ 0x80000000;
    local_2460._24_4_ = uVar17 ^ 0x80000000;
    local_2460._28_4_ = uVar33 ^ 0x80000000;
    auVar43 = ZEXT3264(local_2460);
    uVar22 = auVar24._0_4_;
    local_2480._4_4_ = uVar22;
    local_2480._0_4_ = uVar22;
    local_2480._8_4_ = uVar22;
    local_2480._12_4_ = uVar22;
    local_2480._16_4_ = uVar22;
    local_2480._20_4_ = uVar22;
    local_2480._24_4_ = uVar22;
    local_2480._28_4_ = uVar22;
    auVar44 = ZEXT3264(local_2480);
    local_24b8 = context;
    local_24c0 = ray;
    local_24d0 = uVar18;
    uVar19 = local_24c8;
LAB_019b8124:
    do {
      pauVar6 = pauVar7 + -1;
      pauVar7 = pauVar7 + -1;
      if (*(float *)(*pauVar6 + 8) <= auVar27._0_4_) {
        pauVar6 = pauVar7;
        uVar15 = *(ulong *)*pauVar7;
        while (pauVar7 = pauVar6, (uVar15 & 8) == 0) {
          uVar8 = uVar15 & 0xfffffffffffffff0;
          uVar22 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar26._4_4_ = uVar22;
          auVar26._0_4_ = uVar22;
          auVar26._8_4_ = uVar22;
          auVar26._12_4_ = uVar22;
          auVar26._16_4_ = uVar22;
          auVar26._20_4_ = uVar22;
          auVar26._24_4_ = uVar22;
          auVar26._28_4_ = uVar22;
          auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar19),auVar26,
                                    *(undefined1 (*) [32])(uVar8 + 0x40 + uVar19));
          auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar40._0_32_,auVar38._0_32_);
          auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar18),auVar26,
                                    *(undefined1 (*) [32])(uVar8 + 0x40 + uVar18));
          auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar41._0_32_,auVar39._0_32_);
          auVar4 = vpmaxsd_avx2(ZEXT1632(auVar29),ZEXT1632(auVar24));
          auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + local_24a8),auVar26,
                                    *(undefined1 (*) [32])(uVar8 + 0x40 + local_24a8));
          auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar42._0_32_,auVar43._0_32_);
          auVar5 = vpmaxsd_avx2(ZEXT1632(auVar29),auVar44._0_32_);
          auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar20),auVar26,
                                    *(undefined1 (*) [32])(uVar8 + 0x40 + uVar20));
          local_24a0 = vpmaxsd_avx2(auVar4,auVar5);
          auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar21),auVar26,
                                    *(undefined1 (*) [32])(uVar8 + 0x40 + uVar21));
          auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar40._0_32_,auVar38._0_32_);
          auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar41._0_32_,auVar39._0_32_);
          auVar4 = vpminsd_avx2(ZEXT1632(auVar29),ZEXT1632(auVar24));
          auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar12),auVar26,
                                    *(undefined1 (*) [32])(uVar8 + 0x40 + uVar12));
          auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar42._0_32_,auVar43._0_32_);
          auVar5 = vpminsd_avx2(ZEXT1632(auVar29),auVar23._0_32_);
          auVar4 = vpminsd_avx2(auVar4,auVar5);
          auVar4 = vcmpps_avx(local_24a0,auVar4,2);
          if (((uint)uVar15 & 7) == 6) {
            auVar5 = vcmpps_avx(*(undefined1 (*) [32])(uVar8 + 0x1c0),auVar26,2);
            auVar26 = vcmpps_avx(auVar26,*(undefined1 (*) [32])(uVar8 + 0x1e0),1);
            auVar5 = vandps_avx(auVar5,auVar26);
            auVar4 = vandps_avx(auVar5,auVar4);
            auVar29 = vpackssdw_avx(auVar4._0_16_,auVar4._16_16_);
          }
          else {
            auVar29 = vpackssdw_avx(auVar4._0_16_,auVar4._16_16_);
          }
          auVar29 = vpsllw_avx(auVar29,0xf);
          if ((((((((auVar29 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar29 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar29 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar29 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar29[0xf]) {
            auVar29 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar27 = ZEXT1664(auVar29);
            if (pauVar7 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_019b8124;
          }
          auVar29 = vpacksswb_avx(auVar29,auVar29);
          bVar3 = SUB161(auVar29 >> 7,0) & 1 | (SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                  (SUB161(auVar29 >> 0x17,0) & 1) << 2 | (SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                  (SUB161(auVar29 >> 0x27,0) & 1) << 4 | (SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                  (SUB161(auVar29 >> 0x37,0) & 1) << 6 | SUB161(auVar29 >> 0x3f,0) << 7;
          lVar9 = 0;
          for (uVar15 = (ulong)bVar3; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000)
          {
            lVar9 = lVar9 + 1;
          }
          uVar15 = *(ulong *)(uVar8 + lVar9 * 8);
          uVar17 = bVar3 - 1 & (uint)bVar3;
          uVar10 = (ulong)uVar17;
          pauVar6 = pauVar7;
          if (uVar17 != 0) {
            uVar33 = *(uint *)(local_24a0 + lVar9 * 4);
            lVar9 = 0;
            for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
              lVar9 = lVar9 + 1;
            }
            uVar17 = uVar17 - 1 & uVar17;
            uVar16 = (ulong)uVar17;
            uVar10 = *(ulong *)(uVar8 + lVar9 * 8);
            uVar2 = *(uint *)(local_24a0 + lVar9 * 4);
            uVar18 = local_24d0;
            if (uVar17 == 0) {
              pauVar6 = pauVar7 + 1;
              if (uVar33 < uVar2) {
                *(ulong *)*pauVar7 = uVar10;
                *(uint *)(*pauVar7 + 8) = uVar2;
              }
              else {
                *(ulong *)*pauVar7 = uVar15;
                *(uint *)(*pauVar7 + 8) = uVar33;
                uVar15 = uVar10;
              }
            }
            else {
              auVar24._8_8_ = 0;
              auVar24._0_8_ = uVar15;
              auVar29 = vpunpcklqdq_avx(auVar24,ZEXT416(uVar33));
              auVar28._8_8_ = 0;
              auVar28._0_8_ = uVar10;
              auVar24 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar2));
              lVar9 = 0;
              for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                lVar9 = lVar9 + 1;
              }
              uVar17 = uVar17 - 1 & uVar17;
              uVar15 = (ulong)uVar17;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)(uVar8 + lVar9 * 8);
              auVar28 = vpunpcklqdq_avx(auVar30,ZEXT416(*(uint *)(local_24a0 + lVar9 * 4)));
              if (uVar17 == 0) {
                auVar35 = vpcmpgtd_avx(auVar24,auVar29);
                auVar36 = vpshufd_avx(auVar35,0xaa);
                auVar35 = vblendvps_avx(auVar24,auVar29,auVar36);
                auVar29 = vblendvps_avx(auVar29,auVar24,auVar36);
                auVar24 = vpcmpgtd_avx(auVar28,auVar35);
                auVar36 = vpshufd_avx(auVar24,0xaa);
                auVar24 = vblendvps_avx(auVar28,auVar35,auVar36);
                auVar28 = vblendvps_avx(auVar35,auVar28,auVar36);
                auVar35 = vpcmpgtd_avx(auVar28,auVar29);
                auVar36 = vpshufd_avx(auVar35,0xaa);
                auVar35 = vblendvps_avx(auVar28,auVar29,auVar36);
                auVar29 = vblendvps_avx(auVar29,auVar28,auVar36);
                *pauVar7 = auVar29;
                pauVar7[1] = auVar35;
                uVar15 = auVar24._0_8_;
                pauVar6 = pauVar7 + 2;
              }
              else {
                lVar9 = 0;
                for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                  lVar9 = lVar9 + 1;
                }
                uVar17 = uVar17 - 1 & uVar17;
                uVar10 = (ulong)uVar17;
                auVar32._8_8_ = 0;
                auVar32._0_8_ = *(ulong *)(uVar8 + lVar9 * 8);
                auVar35 = vpunpcklqdq_avx(auVar32,ZEXT416(*(uint *)(local_24a0 + lVar9 * 4)));
                if (uVar17 == 0) {
                  auVar36 = vpcmpgtd_avx(auVar24,auVar29);
                  auVar30 = vpshufd_avx(auVar36,0xaa);
                  auVar36 = vblendvps_avx(auVar24,auVar29,auVar30);
                  auVar29 = vblendvps_avx(auVar29,auVar24,auVar30);
                  auVar24 = vpcmpgtd_avx(auVar35,auVar28);
                  auVar30 = vpshufd_avx(auVar24,0xaa);
                  auVar24 = vblendvps_avx(auVar35,auVar28,auVar30);
                  auVar28 = vblendvps_avx(auVar28,auVar35,auVar30);
                  auVar35 = vpcmpgtd_avx(auVar28,auVar29);
                  auVar30 = vpshufd_avx(auVar35,0xaa);
                  auVar35 = vblendvps_avx(auVar28,auVar29,auVar30);
                  auVar29 = vblendvps_avx(auVar29,auVar28,auVar30);
                  auVar28 = vpcmpgtd_avx(auVar24,auVar36);
                  auVar30 = vpshufd_avx(auVar28,0xaa);
                  auVar28 = vblendvps_avx(auVar24,auVar36,auVar30);
                  auVar24 = vblendvps_avx(auVar36,auVar24,auVar30);
                  auVar36 = vpcmpgtd_avx(auVar35,auVar24);
                  auVar30 = vpshufd_avx(auVar36,0xaa);
                  auVar36 = vblendvps_avx(auVar35,auVar24,auVar30);
                  auVar24 = vblendvps_avx(auVar24,auVar35,auVar30);
                  *pauVar7 = auVar29;
                  pauVar7[1] = auVar24;
                  pauVar7[2] = auVar36;
                  uVar15 = auVar28._0_8_;
                  pauVar6 = pauVar7 + 3;
                }
                else {
                  *pauVar7 = auVar29;
                  pauVar7[1] = auVar24;
                  pauVar7[2] = auVar28;
                  pauVar7[3] = auVar35;
                  lVar9 = 0x30;
                  do {
                    lVar13 = lVar9;
                    lVar9 = 0;
                    for (uVar15 = uVar10; (uVar15 & 1) == 0;
                        uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                      lVar9 = lVar9 + 1;
                    }
                    uVar15 = *(ulong *)(uVar8 + lVar9 * 8);
                    auVar25._8_8_ = 0;
                    auVar25._0_8_ = uVar15;
                    auVar29 = vpunpcklqdq_avx(auVar25,ZEXT416(*(uint *)(local_24a0 + lVar9 * 4)));
                    *(undefined1 (*) [16])(pauVar7[1] + lVar13) = auVar29;
                    uVar10 = uVar10 - 1 & uVar10;
                    lVar9 = lVar13 + 0x10;
                  } while (uVar10 != 0);
                  pauVar6 = (undefined1 (*) [16])(pauVar7[1] + lVar13);
                  if (lVar13 + 0x10 != 0) {
                    lVar9 = 0x10;
                    pauVar11 = pauVar7;
                    do {
                      auVar29 = pauVar11[1];
                      pauVar11 = pauVar11 + 1;
                      uVar17 = vextractps_avx(auVar29,2);
                      lVar13 = lVar9;
                      do {
                        if (uVar17 <= *(uint *)(pauVar7[-1] + lVar13 + 8)) {
                          pauVar14 = (undefined1 (*) [16])(*pauVar7 + lVar13);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar7 + lVar13) =
                             *(undefined1 (*) [16])(pauVar7[-1] + lVar13);
                        lVar13 = lVar13 + -0x10;
                        pauVar14 = pauVar7;
                      } while (lVar13 != 0);
                      *pauVar14 = auVar29;
                      lVar9 = lVar9 + 0x10;
                    } while (pauVar6 != pauVar11);
                    uVar15 = *(ulong *)*pauVar6;
                  }
                }
              }
            }
          }
        }
        local_24b0 = (ulong)((uint)uVar15 & 0xf) - 8;
        if (local_24b0 != 0) {
          prim = (Primitive *)(uVar15 & 0xfffffffffffffff0);
          do {
            InstanceArrayIntersector1MB::intersect(&local_24d1,ray,context,prim);
            prim = prim + 1;
            local_24b0 = local_24b0 + -1;
            context = local_24b8;
            ray = local_24c0;
          } while (local_24b0 != 0);
        }
        fVar34 = (ray->super_RayK<1>).tfar;
        auVar23 = ZEXT3264(CONCAT428(fVar34,CONCAT424(fVar34,CONCAT420(fVar34,CONCAT416(fVar34,
                                                  CONCAT412(fVar34,CONCAT48(fVar34,CONCAT44(fVar34,
                                                  fVar34))))))));
        auVar27 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar40 = ZEXT3264(local_23c0);
        auVar41 = ZEXT3264(local_23e0);
        auVar42 = ZEXT3264(local_2400);
        auVar38 = ZEXT3264(local_2420);
        auVar39 = ZEXT3264(local_2440);
        auVar43 = ZEXT3264(local_2460);
        auVar44 = ZEXT3264(local_2480);
        uVar18 = local_24d0;
        uVar19 = local_24c8;
      }
    } while (pauVar7 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }